

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spherical.cpp
# Opt level: O0

void __thiscall Spherical::Spherical(Spherical *this,double radius)

{
  double radius_local;
  Spherical *this_local;
  
  Parameterization::Parameterization(&this->super_Parameterization,radius);
  (this->super_Parameterization)._vptr_Parameterization =
       (_func_int **)&PTR_PrintPlot3DHeader_00108c50;
  std::__cxx11::string::operator=((string *)&(this->super_Parameterization).name,"Spherical");
  (this->super_Parameterization).Jmax = 200;
  (this->super_Parameterization).Kmax = 100;
  (this->super_Parameterization).Lmax = 1;
  (this->super_Parameterization).Gmax = 1;
  this->theta1_lb = 0.0;
  this->theta1_ub = -6.283185307179586;
  this->d_theta1 =
       (this->theta1_ub - this->theta1_lb) / (double)((this->super_Parameterization).Jmax + -1);
  this->theta2_lb = 3.141592653589793;
  this->theta2_ub = 0.0;
  this->d_theta2 =
       (this->theta2_ub - this->theta2_lb) / (double)((this->super_Parameterization).Kmax + -1);
  return;
}

Assistant:

Spherical::Spherical(double radius) : Parameterization(radius) {
  name = "Spherical";

  Jmax = 200;
  Kmax = 100;
  Lmax = 1;
  Gmax = 1;

  theta1_lb =  0.0e0;
  theta1_ub = -2.0e0 * PI;

  d_theta1 = (theta1_ub - theta1_lb) / (double)(Jmax - 1);

  theta2_lb = PI;
  theta2_ub = 0.0e0;

  d_theta2 = (theta2_ub - theta2_lb) / (double)(Kmax - 1);
}